

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O1

int cuddSymmSiftingConv(DdManager *table,int lower,int upper)

{
  uint uVar1;
  DdSubtable *pDVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  DdHalfWord DVar8;
  uint uVar9;
  int *piVar10;
  void *__base;
  DdNode *pDVar11;
  DdNode *moves;
  DdNode *pDVar12;
  uint *puVar13;
  uint uVar14;
  size_t sVar15;
  DdHalfWord x;
  size_t __nmemb;
  long lVar16;
  DdHalfWord DVar17;
  DdNode *pDVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  uint local_44;
  
  uVar9 = table->keys;
  iVar5 = table->isolated;
  iVar4 = table->size;
  __nmemb = (size_t)iVar4;
  piVar10 = (int *)malloc(__nmemb * 4);
  entry = piVar10;
  if (piVar10 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    __base = malloc(__nmemb * 4);
    if (__base != (void *)0x0) {
      if (0 < iVar4) {
        pDVar2 = table->subtables;
        piVar3 = table->perm;
        sVar15 = 0;
        do {
          piVar10[sVar15] = pDVar2[piVar3[sVar15]].keys;
          *(int *)((long)__base + sVar15 * 4) = (int)sVar15;
          sVar15 = sVar15 + 1;
        } while (__nmemb != sVar15);
      }
      qsort(__base,__nmemb,4,ddSymmUniqueCompare);
      if (lower <= upper) {
        puVar13 = &table->subtables[lower].next;
        uVar14 = lower;
        do {
          *puVar13 = uVar14;
          uVar14 = uVar14 + 1;
          puVar13 = puVar13 + 0xe;
        } while (upper + 1U != uVar14);
      }
      iVar4 = table->siftMaxVar;
      if (table->size < table->siftMaxVar) {
        iVar4 = table->size;
      }
      if (0 < iVar4) {
        lVar16 = 0;
        do {
          if (table->siftMaxSwap <= ddTotalNumberSwapping) break;
          uVar14 = table->perm[*(int *)((long)__base + lVar16 * 4)];
          if ((((int)uVar14 <= upper && lower <= (int)uVar14) &&
              (table->subtables[(int)uVar14].next == uVar14)) &&
             (iVar4 = ddSymmSiftingAux(table,uVar14,lower,upper), iVar4 == 0)) goto LAB_00794b0d;
          lVar16 = lVar16 + 1;
          iVar4 = table->siftMaxVar;
          if (table->size < table->siftMaxVar) {
            iVar4 = table->size;
          }
        } while (lVar16 < iVar4);
      }
      uVar14 = table->keys - table->isolated;
      if (uVar14 < uVar9 - iVar5) {
        do {
          piVar10 = entry;
          uVar20 = 0;
          if (lower <= upper) {
            pDVar2 = table->subtables;
            piVar3 = table->invperm;
            uVar20 = 0;
            uVar9 = lower;
            do {
              do {
                uVar19 = uVar9;
                uVar9 = pDVar2[(int)uVar19].next;
              } while (uVar19 < uVar9);
              iVar5 = piVar3[(int)uVar19];
              piVar10[iVar5] = pDVar2[(int)uVar19].keys;
              *(int *)((long)__base + uVar20 * 4) = iVar5;
              uVar20 = uVar20 + 1;
              uVar9 = uVar19 + 1;
            } while ((int)uVar19 < upper);
          }
          iVar4 = (int)uVar20;
          qsort(__base,uVar20 & 0xffffffff,4,ddSymmUniqueCompare);
          iVar5 = table->siftMaxVar;
          if (iVar4 < table->siftMaxVar) {
            iVar5 = iVar4;
          }
          if (0 < iVar5) {
            lVar16 = 0;
            do {
              if (table->siftMaxSwap <= ddTotalNumberSwapping) break;
              uVar9 = table->perm[*(int *)((long)__base + lVar16 * 4)];
              puVar13 = &table->subtables[(int)uVar9].next;
              uVar19 = *puVar13;
              if (*puVar13 <= uVar9) {
                iVar5 = table->keys - table->isolated;
                if (uVar9 == lower) {
                  pDVar11 = (DdNode *)ddSymmSiftingDown(table,uVar9,upper);
                  if (pDVar11 == (DdNode *)0x0) goto LAB_00794a41;
                  if (pDVar11 == (DdNode *)0x1) {
                    pDVar11 = (DdNode *)0x1;
                    moves = (DdNode *)0x0;
                    goto LAB_00794b88;
                  }
                  DVar17 = pDVar11->ref;
                  uVar1 = DVar17;
                  do {
                    uVar7 = uVar1;
                    uVar1 = table->subtables[(int)uVar7].next;
                  } while (uVar7 < uVar1);
                  if (uVar9 - uVar19 != uVar7 - DVar17) {
                    iVar5 = table->keys - table->isolated;
                    goto LAB_007949a6;
                  }
                  iVar5 = ddSymmSiftingBackward(table,(Move *)pDVar11,iVar5);
                  moves = (DdNode *)0x0;
LAB_007949d9:
                  if (iVar5 != 0) {
                    if (pDVar11 != (DdNode *)0x0) {
                      pDVar12 = table->nextFree;
                      do {
                        pDVar18 = pDVar11;
                        pDVar11 = (pDVar18->type).kids.T;
                        pDVar18->ref = 0;
                        pDVar18->next = pDVar12;
                        pDVar12 = pDVar18;
                      } while (pDVar11 != (DdNode *)0x0);
                      table->nextFree = pDVar18;
                    }
                    if (moves != (DdNode *)0x0) {
                      pDVar11 = table->nextFree;
                      do {
                        pDVar12 = moves;
                        moves = (pDVar12->type).kids.T;
                        pDVar12->ref = 0;
                        pDVar12->next = pDVar11;
                        pDVar11 = pDVar12;
                      } while (moves != (DdNode *)0x0);
                      table->nextFree = pDVar12;
                    }
                    goto LAB_00794a41;
                  }
                }
                else {
                  iVar6 = cuddNextHigh(table,uVar9);
                  if (upper < iVar6) {
                    do {
                      uVar19 = table->subtables[(int)uVar9].next;
                      bVar21 = uVar9 < uVar19;
                      iVar6 = uVar9 - uVar19;
                      uVar9 = uVar19;
                    } while (bVar21);
                    if ((uVar19 == lower) ||
                       (moves = (DdNode *)ddSymmSiftingUp(table,uVar19,lower),
                       moves == (DdNode *)0x0)) goto LAB_00794a41;
                    if (moves == (DdNode *)0x1) {
                      moves = (DdNode *)0x1;
                      pDVar11 = (DdNode *)0x0;
                      goto LAB_00794b88;
                    }
                    DVar17 = moves->index;
                    if (iVar6 == DVar17 - table->subtables[(int)DVar17].next) {
                      iVar5 = ddSymmSiftingBackward(table,(Move *)moves,iVar5);
                      pDVar11 = (DdNode *)0x0;
                      goto LAB_007949d9;
                    }
                    iVar5 = table->keys - table->isolated;
LAB_007949c1:
                    pDVar12 = (DdNode *)ddSymmSiftingDown(table,DVar17,upper);
                    pDVar11 = pDVar12;
LAB_007949d4:
                    iVar5 = ddSymmSiftingBackward(table,(Move *)pDVar12,iVar5);
                    goto LAB_007949d9;
                  }
                  if ((int)(uVar9 - lower) <= (int)(upper - uVar9)) {
                    local_44 = table->subtables[(int)uVar9].next;
                    moves = (DdNode *)ddSymmSiftingUp(table,local_44,lower);
                    if (moves == (DdNode *)0x0) {
                      uVar9 = local_44;
                      do {
                        x = uVar9;
                        uVar9 = table->subtables[(int)x].next;
                      } while (x < uVar9);
                    }
                    else {
                      if (moves == (DdNode *)0x1) {
                        moves = (DdNode *)0x1;
                        pDVar11 = (DdNode *)0x0;
                        goto LAB_00794b88;
                      }
                      x = moves->index;
                      local_44 = table->subtables[(int)x].next;
                    }
                    pDVar12 = (DdNode *)ddSymmSiftingDown(table,x,upper);
                    if (pDVar12 == (DdNode *)0x0) {
                      DVar17 = table->subtables[(int)x].next;
                      DVar8 = x;
                    }
                    else {
                      if (pDVar12 == (DdNode *)0x1) {
                        pDVar11 = (DdNode *)0x1;
                        goto LAB_00794b88;
                      }
                      DVar17 = pDVar12->ref;
                      uVar9 = DVar17;
                      do {
                        DVar8 = uVar9;
                        uVar9 = table->subtables[(int)DVar8].next;
                      } while (DVar8 < uVar9);
                    }
                    pDVar11 = pDVar12;
                    if (x - local_44 != DVar8 - DVar17) {
                      if (moves != (DdNode *)0x0) {
                        pDVar12 = table->nextFree;
                        do {
                          pDVar18 = moves;
                          moves = (pDVar18->type).kids.T;
                          pDVar18->ref = 0;
                          pDVar18->next = pDVar12;
                          pDVar12 = pDVar18;
                        } while (moves != (DdNode *)0x0);
                        table->nextFree = pDVar18;
                      }
                      iVar5 = table->keys - table->isolated;
LAB_007949a6:
                      pDVar12 = (DdNode *)ddSymmSiftingUp(table,DVar17,lower);
                      moves = pDVar12;
                    }
                    goto LAB_007949d4;
                  }
                  pDVar11 = (DdNode *)ddSymmSiftingDown(table,uVar9,upper);
                  if (pDVar11 == (DdNode *)0x0) {
                    do {
                      uVar19 = uVar9;
                      uVar9 = table->subtables[(int)uVar19].next;
                    } while (uVar19 < uVar9);
LAB_0079481d:
                    pDVar12 = (DdNode *)ddSymmSiftingUp(table,uVar9,lower);
                    if (pDVar12 == (DdNode *)0x0) {
                      uVar1 = uVar9;
                      do {
                        DVar17 = uVar1;
                        uVar1 = table->subtables[(int)DVar17].next;
                        uVar7 = uVar9;
                      } while (DVar17 < uVar1);
                    }
                    else {
                      if (pDVar12 == (DdNode *)0x1) {
                        moves = (DdNode *)0x1;
                        goto LAB_00794b88;
                      }
                      DVar17 = pDVar12->index;
                      uVar7 = table->subtables[(int)DVar17].next;
                    }
                    moves = pDVar12;
                    if (uVar19 - uVar9 != DVar17 - uVar7) {
                      if (pDVar11 != (DdNode *)0x0) {
                        pDVar12 = table->nextFree;
                        do {
                          pDVar18 = pDVar11;
                          pDVar11 = (pDVar18->type).kids.T;
                          pDVar18->ref = 0;
                          pDVar18->next = pDVar12;
                          pDVar12 = pDVar18;
                        } while (pDVar11 != (DdNode *)0x0);
                        table->nextFree = pDVar18;
                      }
                      iVar5 = table->keys - table->isolated;
                      goto LAB_007949c1;
                    }
                    goto LAB_007949d4;
                  }
                  if (pDVar11 != (DdNode *)0x1) {
                    uVar9 = pDVar11->ref;
                    uVar1 = uVar9;
                    do {
                      uVar19 = uVar1;
                      uVar1 = table->subtables[(int)uVar19].next;
                    } while (uVar19 < uVar1);
                    goto LAB_0079481d;
                  }
                  pDVar11 = (DdNode *)0x1;
                  moves = (DdNode *)0x0;
                }
LAB_00794b88:
                if ((DdNode *)0x1 < pDVar11) {
                  pDVar12 = table->nextFree;
                  do {
                    pDVar18 = pDVar11;
                    pDVar11 = (pDVar18->type).kids.T;
                    pDVar18->ref = 0;
                    pDVar18->next = pDVar12;
                    pDVar12 = pDVar18;
                  } while (pDVar11 != (DdNode *)0x0);
                  table->nextFree = pDVar18;
                }
                if ((DdNode *)0x1 < moves) {
                  pDVar11 = table->nextFree;
                  do {
                    pDVar12 = moves;
                    moves = (pDVar12->type).kids.T;
                    pDVar12->ref = 0;
                    pDVar12->next = pDVar11;
                    pDVar11 = pDVar12;
                  } while (moves != (DdNode *)0x0);
                  table->nextFree = pDVar12;
                }
                goto LAB_00794b0d;
              }
LAB_00794a41:
              lVar16 = lVar16 + 1;
              iVar5 = table->siftMaxVar;
              if (iVar4 < table->siftMaxVar) {
                iVar5 = iVar4;
              }
            } while (lVar16 < iVar5);
          }
          uVar9 = table->keys - table->isolated;
          bVar21 = uVar9 < uVar14;
          uVar14 = uVar9;
        } while (bVar21);
      }
      iVar5 = 1;
      if (lower <= upper) {
        iVar5 = 0;
        do {
          uVar9 = table->subtables[lower].next;
          uVar19 = lower;
          uVar14 = lower;
          while (uVar1 = uVar19, uVar9 != lower) {
            iVar5 = iVar5 + 1;
            uVar9 = table->subtables[(int)uVar1].next;
            uVar19 = uVar9;
            uVar14 = uVar1;
          }
          lower = uVar14 + 1;
        } while ((int)uVar14 < upper);
        iVar5 = iVar5 + 1;
      }
      free(__base);
      if (entry == (int *)0x0) {
        return iVar5;
      }
      free(entry);
      entry = (int *)0x0;
      return iVar5;
    }
    table->errorCode = CUDD_MEMORY_OUT;
  }
  __base = (void *)0x0;
LAB_00794b0d:
  if (entry != (int *)0x0) {
    free(entry);
    entry = (int *)0x0;
  }
  if (__base != (void *)0x0) {
    free(__base);
  }
  return 0;
}

Assistant:

int
cuddSymmSiftingConv(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         size;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
    int         classes;
    int         initialSize;
#ifdef DD_STATS
    int         previousSize;
#endif

    initialSize = table->keys - table->isolated;

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingConvOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingConvOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,size,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

    /* Initialize the symmetry of each subtable to itself
    ** for first pass of converging symmetric sifting.
    */
    for (i = lower; i <= upper; i++) {
        table->subtables[i].next = i;
    }

    for (i = 0; i < ddMin(table->siftMaxVar, table->size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->perm[var[i]];
        if (x < lower || x > upper) continue;
        /* Only sift if not in symmetry group already. */
        if (table->subtables[x].next == (unsigned) x) {
#ifdef DD_STATS
            previousSize = table->keys - table->isolated;
#endif
            result = ddSymmSiftingAux(table,x,lower,upper);
            if (!result) goto ddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
            if (table->keys < (unsigned) previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > (unsigned) previousSize +
                       table->isolated) {
                (void) fprintf(table->out,"+");
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    /* Sifting now until convergence. */
    while ((unsigned) initialSize > table->keys - table->isolated) {
        initialSize = table->keys - table->isolated;
#ifdef DD_STATS
        (void) fprintf(table->out,"\n");
#endif
        /* Here we consider only one representative for each symmetry class. */
        for (x = lower, classes = 0; x <= upper; x++, classes++) {
            while ((unsigned) x < table->subtables[x].next) {
                x = table->subtables[x].next;
            }
            /* Here x is the largest index in a group.
            ** Groups consist of adjacent variables.
            ** Hence, the next increment of x will move it to a new group.
            */
            i = table->invperm[x];
            entry[i] = table->subtables[x].keys;
            var[classes] = i;
        }

        qsort((void *)var,classes,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

        /* Now sift. */
        for (i = 0; i < ddMin(table->siftMaxVar,classes); i++) {
            if (ddTotalNumberSwapping >= table->siftMaxSwap)
                break;
            x = table->perm[var[i]];
            if ((unsigned) x >= table->subtables[x].next) {
#ifdef DD_STATS
                previousSize = table->keys - table->isolated;
#endif
                result = ddSymmSiftingConvAux(table,x,lower,upper);
                if (!result ) goto ddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
                if (table->keys < (unsigned) previousSize + table->isolated) {
                    (void) fprintf(table->out,"-");
                } else if (table->keys > (unsigned) previousSize +
                           table->isolated) {
                    (void) fprintf(table->out,"+");
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        } /* for */
    }

    ddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out, "\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out, "#:G_SIFTING %8d: symmetric groups",
                   symgroups);
#endif

    ABC_FREE(var);
    ABC_FREE(entry);

    return(1+symvars);

ddSymmSiftingConvOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}